

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

int fits_read_ascii_region(char *filename,WCSdata *wcs,SAORegion **Rgn,int *status)

{
  char cVar1;
  int iVar2;
  SAORegion *aRgn_00;
  FILE *__stream;
  char *pcVar3;
  size_t sVar4;
  ushort **ppuVar5;
  RgnShape *newShape_00;
  double *pdVar6;
  bool bVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  RgnShape *local_118;
  RgnShape *tmpShape;
  RgnShape *newShape;
  SAORegion *aRgn;
  coordFmt cFmt;
  FILE *rgnFile;
  int local_e8;
  int done;
  int i;
  int negdec;
  int nCoords;
  int nParams;
  double ysave;
  double xsave;
  double div;
  double ss;
  double y;
  double x;
  double Y;
  double X;
  double *coords;
  long dd;
  long mm;
  long hh;
  long lineLen;
  long allocLen;
  char *endp;
  char *pY;
  char *pX;
  char *currLoc;
  char *paramPtr;
  char *namePtr;
  char *currLine;
  int *status_local;
  SAORegion **Rgn_local;
  WCSdata *wcs_local;
  char *filename_local;
  
  ysave = 0.0;
  _nCoords = 0.0;
  if (*status == 0) {
    currLine = (char *)status;
    status_local = (int *)Rgn;
    Rgn_local = (SAORegion **)wcs;
    wcs_local = (WCSdata *)filename;
    aRgn_00 = (SAORegion *)malloc(0x58);
    if (aRgn_00 == (SAORegion *)0x0) {
      ffpmsg("Couldn\'t allocate memory to hold Region file contents.");
      currLine[0] = 'q';
      currLine[1] = '\0';
      currLine[2] = '\0';
      currLine[3] = '\0';
      filename_local._4_4_ = 0x71;
    }
    else {
      aRgn_00->nShapes = 0;
      aRgn_00->Shapes = (RgnShape *)0x0;
      if ((Rgn_local == (SAORegion **)0x0) || (*(int *)Rgn_local == 0)) {
        (aRgn_00->wcs).exists = 0;
      }
      else {
        memcpy(&aRgn_00->wcs,Rgn_local,0x48);
      }
      aRgn._4_4_ = 0;
      lineLen = 0x200;
      namePtr = (char *)malloc(0x200);
      if (namePtr == (char *)0x0) {
        free(aRgn_00);
        ffpmsg("Couldn\'t allocate memory to hold Region file contents.");
        currLine[0] = 'q';
        currLine[1] = '\0';
        currLine[2] = '\0';
        currLine[3] = '\0';
        filename_local._4_4_ = 0x71;
      }
      else {
        __stream = fopen((char *)wcs_local,"r");
        if (__stream == (FILE *)0x0) {
          snprintf(namePtr,lineLen,"Could not open Region file %s.",wcs_local);
          ffpmsg(namePtr);
          free(namePtr);
          free(aRgn_00);
          currLine[0] = 'h';
          currLine[1] = '\0';
          currLine[2] = '\0';
          currLine[3] = '\0';
          filename_local._4_4_ = 0x68;
        }
        else {
          currLine[0] = 'h';
          currLine[1] = '\0';
          currLine[2] = '\0';
          currLine[3] = '\0';
LAB_00277887:
          pcVar3 = fgets(namePtr,(int)lineLen,__stream);
          if (pcVar3 != (char *)0x0) {
            currLine[0] = '\0';
            currLine[1] = '\0';
            currLine[2] = '\0';
            currLine[3] = '\0';
            hh = strlen(namePtr);
            while( true ) {
              bVar7 = false;
              if (hh == lineLen + -1) {
                bVar7 = namePtr[hh + -1] != '\n';
              }
              if (!bVar7) break;
              pX = (char *)realloc(namePtr,lineLen << 1);
              if (pX == (char *)0x0) {
                ffpmsg("Couldn\'t allocate memory to hold Region file contents.");
                currLine[0] = 'q';
                currLine[1] = '\0';
                currLine[2] = '\0';
                currLine[3] = '\0';
                goto LAB_002791cc;
              }
              namePtr = pX;
              fgets(pX + hh,(int)lineLen + 1,__stream);
              lineLen = lineLen * 2;
              sVar4 = strlen(namePtr + hh);
              hh = sVar4 + hh;
            }
            pX = namePtr;
            if (*namePtr == '#') {
              do {
                pX = pX + 1;
                ppuVar5 = __ctype_b_loc();
              } while (((*ppuVar5)[(int)*pX] & 0x2000) != 0);
              iVar2 = fits_strncasecmp(pX,"format:",7);
              if (iVar2 == 0) {
                if (aRgn_00->nShapes != 0) {
                  ffpmsg("Format code encountered after reading 1 or more shapes.");
                  currLine[0] = -0x51;
                  currLine[1] = '\x01';
                  currLine[2] = '\0';
                  currLine[3] = '\0';
                  goto LAB_002791cc;
                }
                pX = pX + 7;
                while (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)*pX] & 0x2000) != 0) {
                  pX = pX + 1;
                }
                iVar2 = fits_strncasecmp(pX,"pixel",5);
                if (iVar2 == 0) {
                  aRgn._4_4_ = 0;
                }
                else {
                  iVar2 = fits_strncasecmp(pX,"degree",6);
                  if (iVar2 == 0) {
                    aRgn._4_4_ = 1;
                  }
                  else {
                    iVar2 = fits_strncasecmp(pX,"hhmmss",6);
                    if ((iVar2 != 0) && (iVar2 = fits_strncasecmp(pX,"hms",3), iVar2 != 0)) {
                      ffpmsg("Unknown format code encountered in region file.");
                      currLine[0] = -0x51;
                      currLine[1] = '\x01';
                      currLine[2] = '\0';
                      currLine[3] = '\0';
                      goto LAB_002791cc;
                    }
                    aRgn._4_4_ = 2;
                  }
                }
              }
            }
            else {
              iVar2 = fits_strncasecmp(namePtr,"glob",4);
              if (iVar2 != 0) {
LAB_00277b3d:
                do {
                  if (*pX == '\0') break;
                  paramPtr = pX;
                  currLoc = (char *)0x0;
                  negdec = 1;
                  bVar7 = false;
                  pcVar3 = currLoc;
LAB_00277b71:
                  currLoc = pcVar3;
                  bVar8 = false;
                  if ((!bVar7) && (bVar8 = false, *(int *)currLine == 0)) {
                    bVar8 = *pX != '\0';
                  }
                  if (bVar8) {
                    cVar1 = *pX;
                    pcVar3 = currLoc;
                    if ((cVar1 == '\n') || (cVar1 == '#')) {
                      *pX = '\0';
                      if (currLoc == (char *)0x0) {
                        bVar7 = true;
                      }
                    }
                    else {
                      if (cVar1 != '(') {
                        if (cVar1 == ')') {
                          *pX = '\0';
                          pX = pX + 1;
                          if (currLoc == (char *)0x0) {
                            currLine[0] = '\x01';
                            currLine[1] = '\0';
                            currLine[2] = '\0';
                            currLine[3] = '\0';
                          }
                          else {
                            bVar7 = true;
                          }
                          goto LAB_00277b71;
                        }
                        if (cVar1 == ',') {
                          negdec = negdec + 1;
                        }
                        else {
                          if (cVar1 == ':') {
                            pX = pX + 1;
                            if (currLoc != (char *)0x0) {
                              aRgn._4_4_ = 2;
                            }
                            goto LAB_00277b71;
                          }
                          if (cVar1 == 'd') {
                            pX = pX + 1;
                            if (currLoc != (char *)0x0) {
                              aRgn._4_4_ = 1;
                            }
                            goto LAB_00277b71;
                          }
                        }
                        pX = pX + 1;
                        goto LAB_00277b71;
                      }
                      *pX = '\0';
                      pX = pX + 1;
                      pcVar3 = pX;
                      if (currLoc != (char *)0x0) {
                        currLine[0] = '\x01';
                        currLine[1] = '\0';
                        currLine[2] = '\0';
                        currLine[3] = '\0';
                        pcVar3 = currLoc;
                      }
                    }
                    goto LAB_00277b71;
                  }
                  if ((*(int *)currLine != 0) || (!bVar7)) {
                    ffpmsg("Error reading Region file");
                    currLine[0] = -0x51;
                    currLine[1] = '\x01';
                    currLine[2] = '\0';
                    currLine[3] = '\0';
                    goto LAB_002791cc;
                  }
                  while (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)*paramPtr] & 0x2000) != 0) {
                    paramPtr = paramPtr + 1;
                  }
                  if ((*paramPtr != '\0') || (currLoc != (char *)0x0)) {
                    iVar2 = fits_strncasecmp(paramPtr,"image;",6);
                    if (iVar2 == 0) {
                      paramPtr = paramPtr + 6;
                      aRgn._4_4_ = 0;
                    }
                    else {
                      iVar2 = fits_strncasecmp(paramPtr,"physical;",9);
                      if (iVar2 == 0) {
                        paramPtr = paramPtr + 9;
                        aRgn._4_4_ = 0;
                      }
                      else {
                        iVar2 = fits_strncasecmp(paramPtr,"linear;",7);
                        if (iVar2 == 0) {
                          paramPtr = paramPtr + 7;
                          aRgn._4_4_ = 0;
                        }
                        else {
                          iVar2 = fits_strncasecmp(paramPtr,"fk4;",4);
                          if (iVar2 == 0) {
                            paramPtr = paramPtr + 4;
                            aRgn._4_4_ = 1;
                          }
                          else {
                            iVar2 = fits_strncasecmp(paramPtr,"fk5;",4);
                            if (iVar2 == 0) {
                              paramPtr = paramPtr + 4;
                              aRgn._4_4_ = 1;
                            }
                            else {
                              iVar2 = fits_strncasecmp(paramPtr,"icrs;",5);
                              if (iVar2 == 0) {
                                paramPtr = paramPtr + 5;
                                aRgn._4_4_ = 1;
                              }
                              else {
                                iVar2 = fits_strncasecmp(paramPtr,"fk5",3);
                                if (iVar2 == 0) {
                                  aRgn._4_4_ = 1;
                                  goto LAB_00277b3d;
                                }
                                iVar2 = fits_strncasecmp(paramPtr,"fk4",3);
                                if (iVar2 == 0) {
                                  aRgn._4_4_ = 1;
                                  goto LAB_00277b3d;
                                }
                                iVar2 = fits_strncasecmp(paramPtr,"icrs",4);
                                if (iVar2 == 0) {
                                  aRgn._4_4_ = 1;
                                  goto LAB_00277b3d;
                                }
                                iVar2 = fits_strncasecmp(paramPtr,"image",5);
                                if (iVar2 == 0) {
                                  aRgn._4_4_ = 0;
                                  goto LAB_00277b3d;
                                }
                                iVar2 = fits_strncasecmp(paramPtr,"physical",8);
                                if (iVar2 == 0) {
                                  aRgn._4_4_ = 0;
                                  goto LAB_00277b3d;
                                }
                                iVar2 = fits_strncasecmp(paramPtr,"galactic;",9);
                                if (iVar2 == 0) {
                                  ffpmsg("Galactic region coordinates not supported");
                                  ffpmsg(paramPtr);
                                  currLine[0] = -0x51;
                                  currLine[1] = '\x01';
                                  currLine[2] = '\0';
                                  currLine[3] = '\0';
                                  goto LAB_002791cc;
                                }
                                iVar2 = fits_strncasecmp(paramPtr,"ecliptic;",9);
                                if (iVar2 == 0) {
                                  ffpmsg("ecliptic region coordinates not supported");
                                  ffpmsg(paramPtr);
                                  currLine[0] = -0x51;
                                  currLine[1] = '\x01';
                                  currLine[2] = '\0';
                                  currLine[3] = '\0';
                                  goto LAB_002791cc;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    if (aRgn_00->nShapes % 10 == 0) {
                      if (aRgn_00->Shapes == (RgnShape *)0x0) {
                        local_118 = (RgnShape *)malloc(0x690);
                      }
                      else {
                        local_118 = (RgnShape *)
                                    realloc(aRgn_00->Shapes,(long)(aRgn_00->nShapes + 10) * 0xa8);
                      }
                      if (local_118 == (RgnShape *)0x0) {
                        ffpmsg("Failed to allocate memory for Region data");
                        currLine[0] = 'q';
                        currLine[1] = '\0';
                        currLine[2] = '\0';
                        currLine[3] = '\0';
                        goto LAB_002791cc;
                      }
                      aRgn_00->Shapes = local_118;
                    }
                    iVar2 = aRgn_00->nShapes;
                    aRgn_00->nShapes = iVar2 + 1;
                    newShape_00 = aRgn_00->Shapes + iVar2;
                    newShape_00->sign = '\x01';
                    newShape_00->shape = point_rgn;
                    for (local_e8 = 0; local_e8 < 8; local_e8 = local_e8 + 1) {
                      *(undefined8 *)((long)&newShape_00->param + (long)local_e8 * 8) = 0;
                    }
                    (newShape_00->param).gen.a = 0.0;
                    (newShape_00->param).gen.b = 0.0;
                    (newShape_00->param).gen.sinT = 0.0;
                    (newShape_00->param).gen.cosT = 0.0;
                    while (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)*paramPtr] & 0x2000) != 0) {
                      paramPtr = paramPtr + 1;
                    }
                    if (*paramPtr == '+') {
                      paramPtr = paramPtr + 1;
                    }
                    else if (*paramPtr == '-') {
                      paramPtr = paramPtr + 1;
                      newShape_00->sign = '\0';
                    }
                    while (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)*paramPtr] & 0x2000) != 0) {
                      paramPtr = paramPtr + 1;
                    }
                    if (*paramPtr == '\0') {
                      ffpmsg("Error reading Region file");
                      currLine[0] = -0x51;
                      currLine[1] = '\x01';
                      currLine[2] = '\0';
                      currLine[3] = '\0';
                      goto LAB_002791cc;
                    }
                    hh = strlen(paramPtr);
                    while( true ) {
                      hh = hh - 1;
                      ppuVar5 = __ctype_b_loc();
                      if (((*ppuVar5)[(int)paramPtr[hh]] & 0x2000) == 0) break;
                      paramPtr[hh] = '\0';
                    }
                    iVar2 = fits_strcasecmp(paramPtr,"circle");
                    if (iVar2 == 0) {
                      newShape_00->shape = circle_rgn;
                      if (negdec != 3) {
                        currLine[0] = -0x51;
                        currLine[1] = '\x01';
                        currLine[2] = '\0';
                        currLine[3] = '\0';
                      }
                      i = 2;
                    }
                    else {
                      iVar2 = fits_strcasecmp(paramPtr,"annulus");
                      if (iVar2 == 0) {
                        newShape_00->shape = annulus_rgn;
                        if (negdec != 4) {
                          currLine[0] = -0x51;
                          currLine[1] = '\x01';
                          currLine[2] = '\0';
                          currLine[3] = '\0';
                        }
                        i = 2;
                      }
                      else {
                        iVar2 = fits_strcasecmp(paramPtr,"ellipse");
                        if (iVar2 == 0) {
                          if ((negdec < 4) || (8 < negdec)) {
                            currLine[0] = -0x51;
                            currLine[1] = '\x01';
                            currLine[2] = '\0';
                            currLine[3] = '\0';
                          }
                          else if (negdec < 6) {
                            newShape_00->shape = ellipse_rgn;
                            (newShape_00->param).gen.p[4] = 0.0;
                          }
                          else {
                            newShape_00->shape = elliptannulus_rgn;
                            (newShape_00->param).gen.p[6] = 0.0;
                            (newShape_00->param).gen.p[7] = 0.0;
                          }
                          i = 2;
                        }
                        else {
                          iVar2 = fits_strcasecmp(paramPtr,"elliptannulus");
                          if (iVar2 == 0) {
                            newShape_00->shape = elliptannulus_rgn;
                            if ((negdec != 8) && (negdec != 6)) {
                              currLine[0] = -0x51;
                              currLine[1] = '\x01';
                              currLine[2] = '\0';
                              currLine[3] = '\0';
                            }
                            (newShape_00->param).gen.p[6] = 0.0;
                            (newShape_00->param).gen.p[7] = 0.0;
                            i = 2;
                          }
                          else {
                            iVar2 = fits_strcasecmp(paramPtr,"box");
                            if ((iVar2 == 0) ||
                               (iVar2 = fits_strcasecmp(paramPtr,"rotbox"), iVar2 == 0)) {
                              if ((negdec < 4) || (8 < negdec)) {
                                currLine[0] = -0x51;
                                currLine[1] = '\x01';
                                currLine[2] = '\0';
                                currLine[3] = '\0';
                              }
                              else if (negdec < 6) {
                                newShape_00->shape = box_rgn;
                                (newShape_00->param).gen.p[4] = 0.0;
                              }
                              else {
                                newShape_00->shape = boxannulus_rgn;
                                (newShape_00->param).gen.p[6] = 0.0;
                                (newShape_00->param).gen.p[7] = 0.0;
                              }
                              i = 2;
                            }
                            else {
                              iVar2 = fits_strcasecmp(paramPtr,"rectangle");
                              if ((iVar2 == 0) ||
                                 (iVar2 = fits_strcasecmp(paramPtr,"rotrectangle"), iVar2 == 0)) {
                                newShape_00->shape = rectangle_rgn;
                                if ((negdec < 4) || (5 < negdec)) {
                                  currLine[0] = -0x51;
                                  currLine[1] = '\x01';
                                  currLine[2] = '\0';
                                  currLine[3] = '\0';
                                }
                                (newShape_00->param).gen.p[4] = 0.0;
                                i = 4;
                              }
                              else {
                                iVar2 = fits_strcasecmp(paramPtr,"diamond");
                                if ((((iVar2 == 0) ||
                                     (iVar2 = fits_strcasecmp(paramPtr,"rotdiamond"), iVar2 == 0))
                                    || (iVar2 = fits_strcasecmp(paramPtr,"rhombus"), iVar2 == 0)) ||
                                   (iVar2 = fits_strcasecmp(paramPtr,"rotrhombus"), iVar2 == 0)) {
                                  newShape_00->shape = diamond_rgn;
                                  if ((negdec < 4) || (5 < negdec)) {
                                    currLine[0] = -0x51;
                                    currLine[1] = '\x01';
                                    currLine[2] = '\0';
                                    currLine[3] = '\0';
                                  }
                                  (newShape_00->param).gen.p[4] = 0.0;
                                  i = 2;
                                }
                                else {
                                  iVar2 = fits_strcasecmp(paramPtr,"sector");
                                  if ((iVar2 == 0) ||
                                     (iVar2 = fits_strcasecmp(paramPtr,"pie"), iVar2 == 0)) {
                                    newShape_00->shape = sector_rgn;
                                    if (negdec != 4) {
                                      currLine[0] = -0x51;
                                      currLine[1] = '\x01';
                                      currLine[2] = '\0';
                                      currLine[3] = '\0';
                                    }
                                    i = 2;
                                  }
                                  else {
                                    iVar2 = fits_strcasecmp(paramPtr,"point");
                                    if (iVar2 == 0) {
                                      newShape_00->shape = point_rgn;
                                      if (negdec != 2) {
                                        currLine[0] = -0x51;
                                        currLine[1] = '\x01';
                                        currLine[2] = '\0';
                                        currLine[3] = '\0';
                                      }
                                      i = 2;
                                    }
                                    else {
                                      iVar2 = fits_strcasecmp(paramPtr,"line");
                                      if (iVar2 == 0) {
                                        newShape_00->shape = line_rgn;
                                        if (negdec != 4) {
                                          currLine[0] = -0x51;
                                          currLine[1] = '\x01';
                                          currLine[2] = '\0';
                                          currLine[3] = '\0';
                                        }
                                        i = 4;
                                      }
                                      else {
                                        iVar2 = fits_strcasecmp(paramPtr,"polygon");
                                        if (iVar2 == 0) {
                                          newShape_00->shape = poly_rgn;
                                          if ((negdec < 6) || ((negdec & 1U) != 0)) {
                                            currLine[0] = -0x51;
                                            currLine[1] = '\x01';
                                            currLine[2] = '\0';
                                            currLine[3] = '\0';
                                          }
                                          i = negdec;
                                        }
                                        else {
                                          iVar2 = fits_strcasecmp(paramPtr,"panda");
                                          if (iVar2 == 0) {
                                            newShape_00->shape = panda_rgn;
                                            if (negdec != 8) {
                                              currLine[0] = -0x51;
                                              currLine[1] = '\x01';
                                              currLine[2] = '\0';
                                              currLine[3] = '\0';
                                            }
                                          }
                                          else {
                                            iVar2 = fits_strcasecmp(paramPtr,"epanda");
                                            if (iVar2 == 0) {
                                              newShape_00->shape = epanda_rgn;
                                              if ((negdec < 10) || (0xb < negdec)) {
                                                currLine[0] = -0x51;
                                                currLine[1] = '\x01';
                                                currLine[2] = '\0';
                                                currLine[3] = '\0';
                                              }
                                              (newShape_00->param).gen.p[10] = 0.0;
                                            }
                                            else {
                                              iVar2 = fits_strcasecmp(paramPtr,"bpanda");
                                              if (iVar2 != 0) {
                                                ffpmsg("Unrecognized region found in region file:");
                                                ffpmsg(paramPtr);
                                                currLine[0] = -0x51;
                                                currLine[1] = '\x01';
                                                currLine[2] = '\0';
                                                currLine[3] = '\0';
                                                goto LAB_002791cc;
                                              }
                                              newShape_00->shape = bpanda_rgn;
                                              if ((negdec < 10) || (0xb < negdec)) {
                                                currLine[0] = -0x51;
                                                currLine[1] = '\x01';
                                                currLine[2] = '\0';
                                                currLine[3] = '\0';
                                              }
                                              (newShape_00->param).gen.p[10] = 0.0;
                                            }
                                          }
                                          i = 2;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    if (*(int *)currLine != 0) {
                      ffpmsg("Wrong number of parameters found for region");
                      ffpmsg(paramPtr);
                      goto LAB_002791cc;
                    }
                    if (newShape_00->shape == poly_rgn) {
                      pdVar6 = (double *)malloc((long)negdec << 3);
                      (newShape_00->param).poly.Pts = pdVar6;
                      if ((newShape_00->param).poly.Pts == (double *)0x0) {
                        ffpmsg("Could not allocate memory to hold polygon parameters");
                        currLine[0] = 'q';
                        currLine[1] = '\0';
                        currLine[2] = '\0';
                        currLine[3] = '\0';
                        goto LAB_002791cc;
                      }
                      (newShape_00->param).poly.nPts = negdec;
                      X = (newShape_00->param).gen.p[1];
                    }
                    else {
                      X = (double)&newShape_00->param;
                    }
                    for (local_e8 = 0; pcVar3 = currLoc, local_e8 < i; local_e8 = local_e8 + 2) {
                      pY = currLoc;
                      for (; *currLoc != ','; currLoc = currLoc + 1) {
                      }
                      endp = currLoc + 1;
                      *currLoc = '\0';
                      currLoc = endp;
                      while( true ) {
                        bVar7 = false;
                        if (*currLoc != ',') {
                          bVar7 = *currLoc != '\0';
                        }
                        if (!bVar7) break;
                        currLoc = currLoc + 1;
                      }
                      *currLoc = '\0';
                      currLoc = currLoc + 1;
                      pcVar3 = strchr(pcVar3,0x3a);
                      if (pcVar3 == (char *)0x0) {
                        Y = atof(pY);
                        x = atof(endp);
                      }
                      else {
                        aRgn._4_4_ = 2;
                        dd = 0;
                        div = 0.0;
                        mm = strtol(pY,(char **)&allocLen,10);
                        if ((allocLen != 0) && (*(char *)allocLen == ':')) {
                          pY = (char *)(allocLen + 1);
                          dd = strtol(pY,(char **)&allocLen,10);
                          if ((allocLen != 0) && (*(char *)allocLen == ':')) {
                            pY = (char *)(allocLen + 1);
                            div = atof(pY);
                          }
                        }
                        Y = ((double)mm + (double)dd / 60.0 + div / 3600.0) * 15.0;
                        dd = 0;
                        div = 0.0;
                        while (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)*endp] & 0x2000) != 0) {
                          endp = endp + 1;
                        }
                        cVar1 = *endp;
                        if (cVar1 == '-') {
                          endp = endp + 1;
                        }
                        coords = (double *)strtol(endp,(char **)&allocLen,10);
                        if ((allocLen != 0) && (*(char *)allocLen == ':')) {
                          endp = (char *)(allocLen + 1);
                          dd = strtol(endp,(char **)&allocLen,10);
                          if ((allocLen != 0) && (*(char *)allocLen == ':')) {
                            endp = (char *)(allocLen + 1);
                            div = atof(endp);
                          }
                        }
                        if (cVar1 == '-') {
                          x = ((double)-(long)coords - (double)dd / 60.0) - div / 3600.0;
                        }
                        else {
                          x = (double)(long)coords + (double)dd / 60.0 + div / 3600.0;
                        }
                      }
                      if (local_e8 == 0) {
                        ysave = Y;
                        _nCoords = x;
                      }
                      if (aRgn._4_4_ != 0) {
                        if ((Rgn_local == (SAORegion **)0x0) || (*(int *)Rgn_local == 0)) {
                          ffpmsg("WCS information needed to convert region coordinates.");
                          currLine[0] = -7;
                          currLine[1] = '\x01';
                          currLine[2] = '\0';
                          currLine[3] = '\0';
                          goto LAB_002791cc;
                        }
                        iVar2 = ffxypx(Y,x,(double)Rgn_local[1],(double)Rgn_local[2],
                                       (double)Rgn_local[3],(double)Rgn_local[4],
                                       (double)Rgn_local[5],(double)Rgn_local[6],
                                       (double)Rgn_local[7],(char *)(Rgn_local + 8),&y,&ss,
                                       (int *)currLine);
                        if (iVar2 != 0) {
                          ffpmsg("Error converting region to pixel coordinates.");
                          goto LAB_002791cc;
                        }
                        Y = y;
                        x = ss;
                      }
                      *(double *)((long)X + (long)local_e8 * 8) = Y;
                      *(double *)((long)X + (long)(local_e8 + 1) * 8) = x;
                    }
                    for (; pcVar3 = currLoc, local_e8 < negdec; local_e8 = local_e8 + 1) {
                      pY = currLoc;
                      while( true ) {
                        bVar7 = false;
                        if (*currLoc != ',') {
                          bVar7 = *currLoc != '\0';
                        }
                        if (!bVar7) break;
                        currLoc = currLoc + 1;
                      }
                      *currLoc = '\0';
                      currLoc = currLoc + 1;
                      dVar9 = strtod(pcVar3,(char **)&allocLen);
                      *(double *)((long)X + (long)local_e8 * 8) = dVar9;
                      if ((allocLen != 0) &&
                         (((*(char *)allocLen == '\"' || (*(char *)allocLen == '\'')) ||
                          (*(char *)allocLen == 'd')))) {
                        xsave = 1.0;
                        if (*(char *)allocLen == '\"') {
                          xsave = 3600.0;
                        }
                        if (*(char *)allocLen == '\'') {
                          xsave = 60.0;
                        }
                        if (0.0 <= _nCoords) {
                          x = _nCoords - *(double *)((long)X + (long)local_e8 * 8) / xsave;
                        }
                        else {
                          x = _nCoords + *(double *)((long)X + (long)local_e8 * 8) / xsave;
                        }
                        Y = ysave;
                        iVar2 = ffxypx(ysave,x,(double)Rgn_local[1],(double)Rgn_local[2],
                                       (double)Rgn_local[3],(double)Rgn_local[4],
                                       (double)Rgn_local[5],(double)Rgn_local[6],
                                       (double)Rgn_local[7],(char *)(Rgn_local + 8),&y,&ss,
                                       (int *)currLine);
                        if (iVar2 != 0) {
                          ffpmsg("Error converting region to pixel coordinates.");
                          goto LAB_002791cc;
                        }
                        dVar9 = pow(y - *(double *)X,2.0);
                        dVar10 = pow(ss - *(double *)((long)X + 8),2.0);
                        dVar9 = sqrt(dVar9 + dVar10);
                        *(double *)((long)X + (long)local_e8 * 8) = dVar9;
                      }
                    }
                    if (((newShape_00->shape == elliptannulus_rgn) ||
                        (newShape_00->shape == boxannulus_rgn)) && (negdec == 7)) {
                      *(undefined8 *)((long)X + 0x38) = *(undefined8 *)((long)X + 0x30);
                    }
                    if (aRgn._4_4_ != 0) {
                      switch(newShape_00->shape) {
                      case ellipse_rgn:
                      case box_rgn:
                      case rectangle_rgn:
                      case diamond_rgn:
                        *(double *)((long)X + 0x20) =
                             (double)Rgn_local[7] + *(double *)((long)X + 0x20);
                        break;
                      case elliptannulus_rgn:
                      case boxannulus_rgn:
                        *(double *)((long)X + 0x30) =
                             (double)Rgn_local[7] + *(double *)((long)X + 0x30);
                        *(double *)((long)X + 0x38) =
                             (double)Rgn_local[7] + *(double *)((long)X + 0x38);
                        break;
                      case sector_rgn:
                      case panda_rgn:
                        *(double *)((long)X + 0x10) =
                             (double)Rgn_local[7] + *(double *)((long)X + 0x10);
                        *(double *)((long)X + 0x18) =
                             (double)Rgn_local[7] + *(double *)((long)X + 0x18);
                        break;
                      case epanda_rgn:
                      case bpanda_rgn:
                        *(double *)((long)X + 0x10) =
                             (double)Rgn_local[7] + *(double *)((long)X + 0x10);
                        *(double *)((long)X + 0x18) =
                             (double)Rgn_local[7] + *(double *)((long)X + 0x18);
                        *(double *)((long)X + 0x50) =
                             (double)Rgn_local[7] + *(double *)((long)X + 0x50);
                      default:
                      }
                    }
                    fits_setup_shape(newShape_00);
                  }
                } while( true );
              }
            }
            goto LAB_00277887;
          }
          fits_set_region_components(aRgn_00);
LAB_002791cc:
          if (*(int *)currLine == 0) {
            *(SAORegion **)status_local = aRgn_00;
          }
          else {
            fits_free_region(aRgn_00);
          }
          fclose(__stream);
          free(namePtr);
          filename_local._4_4_ = *(int *)currLine;
        }
      }
    }
  }
  else {
    filename_local._4_4_ = *status;
  }
  return filename_local._4_4_;
}

Assistant:

int fits_read_ascii_region( const char *filename,
			    WCSdata    *wcs,
			    SAORegion  **Rgn,
			    int        *status )
/*  Read regions from a SAO-style region file and return the information     */
/*  in the "SAORegion" structure.  If it is nonNULL, use wcs to convert the  */
/*  region coordinates to pixels.  Return an error if region is in degrees   */
/*  but no WCS data is provided.                                             */
/*---------------------------------------------------------------------------*/
{
   char     *currLine;
   char     *namePtr, *paramPtr, *currLoc;
   char     *pX, *pY, *endp;
   long     allocLen, lineLen, hh, mm, dd;
   double   *coords, X, Y, x, y, ss, div, xsave= 0., ysave= 0.;
   int      nParams, nCoords, negdec;
   int      i, done;
   FILE     *rgnFile;
   coordFmt cFmt;
   SAORegion *aRgn;
   RgnShape *newShape, *tmpShape;

   if( *status ) return( *status );

   aRgn = (SAORegion *)malloc( sizeof(SAORegion) );
   if( ! aRgn ) {
      ffpmsg("Couldn't allocate memory to hold Region file contents.");
      return(*status = MEMORY_ALLOCATION );
   }
   aRgn->nShapes    =    0;
   aRgn->Shapes     = NULL;
   if( wcs && wcs->exists )
      aRgn->wcs = *wcs;
   else
      aRgn->wcs.exists = 0;

   cFmt = pixel_fmt; /* set default format */

   /*  Allocate Line Buffer  */

   allocLen = 512;
   currLine = (char *)malloc( allocLen * sizeof(char) );
   if( !currLine ) {
      free( aRgn );
      ffpmsg("Couldn't allocate memory to hold Region file contents.");
      return(*status = MEMORY_ALLOCATION );
   }

   /*  Open Region File  */

   if( (rgnFile = fopen( filename, "r" ))==NULL ) {
      snprintf(currLine,allocLen,"Could not open Region file %s.",filename);
      ffpmsg( currLine );
      free( currLine );
      free( aRgn );
      return( *status = FILE_NOT_OPENED );
   }
   
   /*  Read in file, line by line  */
   /*  First, set error status in case file is empty */ 
   *status = FILE_NOT_OPENED;

   while( fgets(currLine,allocLen,rgnFile) != NULL ) {

      /* reset status if we got here */
      *status = 0;

      /*  Make sure we have a full line of text  */

      lineLen = strlen(currLine);
      while( lineLen==allocLen-1 && currLine[lineLen-1]!='\n' ) {
         currLoc = (char *)realloc( currLine, 2 * allocLen * sizeof(char) );
         if( !currLoc ) {
            ffpmsg("Couldn't allocate memory to hold Region file contents.");
            *status = MEMORY_ALLOCATION;
            goto error;
         } else {
            currLine = currLoc;
         }
         fgets( currLine+lineLen, allocLen+1, rgnFile );
         allocLen += allocLen;
         lineLen  += strlen(currLine+lineLen);
      }

      currLoc = currLine;
      if( *currLoc == '#' ) {

         /*  Look to see if it is followed by a format statement...  */
         /*  if not skip line                                        */

         currLoc++;
         while( isspace(*currLoc) ) currLoc++;
         if( !fits_strncasecmp( currLoc, "format:", 7 ) ) {
            if( aRgn->nShapes ) {
               ffpmsg("Format code encountered after reading 1 or more shapes.");
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }
            currLoc += 7;
            while( isspace(*currLoc) ) currLoc++;
            if( !fits_strncasecmp( currLoc, "pixel", 5 ) ) {
               cFmt = pixel_fmt;
            } else if( !fits_strncasecmp( currLoc, "degree", 6 ) ) {
               cFmt = degree_fmt;
            } else if( !fits_strncasecmp( currLoc, "hhmmss", 6 ) ) {
               cFmt = hhmmss_fmt;
            } else if( !fits_strncasecmp( currLoc, "hms", 3 ) ) {
               cFmt = hhmmss_fmt;
            } else {
               ffpmsg("Unknown format code encountered in region file.");
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }
         }

      } else if( !fits_strncasecmp( currLoc, "glob", 4 ) ) {
		  /* skip lines that begin with the word 'global' */

      } else {

         while( *currLoc != '\0' ) {

            namePtr  = currLoc;
            paramPtr = NULL;
            nParams  = 1;

            /*  Search for closing parenthesis  */

            done = 0;
            while( !done && !*status && *currLoc ) {
               switch (*currLoc) {
               case '(':
                  *currLoc = '\0';
                  currLoc++;
                  if( paramPtr )   /* Can't have two '(' in a region! */
                     *status = 1;
                  else
                     paramPtr = currLoc;
                  break;
               case ')':
                  *currLoc = '\0';
                  currLoc++;
                  if( !paramPtr )  /* Can't have a ')' without a '(' first */
                     *status = 1;
                  else
                     done = 1;
                  break;
               case '#':
               case '\n':
                  *currLoc = '\0';
                  if( !paramPtr )  /* Allow for a blank line */
                     done = 1;
                  break;
               case ':':  
                  currLoc++;
                  if ( paramPtr ) cFmt = hhmmss_fmt; /* set format if parameter has : */
                  break;
               case 'd':
                  currLoc++;
                  if ( paramPtr ) cFmt = degree_fmt; /* set format if parameter has d */  
                  break;
               case ',':
                  nParams++;  /* Fall through to default */
               default:
                  currLoc++;
                  break;
               }
            }
            if( *status || !done ) {
               ffpmsg( "Error reading Region file" );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }

            /*  Skip white space in region name  */

            while( isspace(*namePtr) ) namePtr++;

            /*  Was this a blank line? Or the end of the current one  */

            if( ! *namePtr && ! paramPtr ) continue;

            /*  Check for format code at beginning of the line */

            if( !fits_strncasecmp( namePtr, "image;", 6 ) ) {
				namePtr += 6;
				cFmt = pixel_fmt;
            } else if( !fits_strncasecmp( namePtr, "physical;", 9 ) ) {
                                namePtr += 9;
                                cFmt = pixel_fmt;
            } else if( !fits_strncasecmp( namePtr, "linear;", 7 ) ) {
                                namePtr += 7;
                                cFmt = pixel_fmt;
            } else if( !fits_strncasecmp( namePtr, "fk4;", 4 ) ) {
				namePtr += 4;
				cFmt = degree_fmt;
            } else if( !fits_strncasecmp( namePtr, "fk5;", 4 ) ) {
				namePtr += 4;
				cFmt = degree_fmt;
            } else if( !fits_strncasecmp( namePtr, "icrs;", 5 ) ) {
				namePtr += 5;
				cFmt = degree_fmt;

            /* the following 5 cases support region files created by POW 
	       (or ds9 Version 4.x) which
               may have lines containing  only a format code, not followed
               by a ';' (and with no region specifier on the line).  We use
               the 'continue' statement to jump to the end of the loop and
               then continue reading the next line of the region file. */

            } else if( !fits_strncasecmp( namePtr, "fk5", 3 ) ) {
				cFmt = degree_fmt;
                                continue;  /* supports POW region file format */
            } else if( !fits_strncasecmp( namePtr, "fk4", 3 ) ) {
				cFmt = degree_fmt;
                                continue;  /* supports POW region file format */
            } else if( !fits_strncasecmp( namePtr, "icrs", 4 ) ) {
				cFmt = degree_fmt;
                                continue;  /* supports POW region file format */
            } else if( !fits_strncasecmp( namePtr, "image", 5 ) ) {
				cFmt = pixel_fmt;
                                continue;  /* supports POW region file format */
            } else if( !fits_strncasecmp( namePtr, "physical", 8 ) ) {
				cFmt = pixel_fmt;
                                continue;  /* supports POW region file format */


            } else if( !fits_strncasecmp( namePtr, "galactic;", 9 ) ) {
               ffpmsg( "Galactic region coordinates not supported" );
               ffpmsg( namePtr );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            } else if( !fits_strncasecmp( namePtr, "ecliptic;", 9 ) ) {
               ffpmsg( "ecliptic region coordinates not supported" );
               ffpmsg( namePtr );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }

            /**************************************************/
            /*  We've apparently found a region... Set it up  */
            /**************************************************/

            if( !(aRgn->nShapes % 10) ) {
               if( aRgn->Shapes )
                  tmpShape = (RgnShape *)realloc( aRgn->Shapes,
                                                  (10+aRgn->nShapes)
                                                  * sizeof(RgnShape) );
               else
                  tmpShape = (RgnShape *) malloc( 10 * sizeof(RgnShape) );
               if( tmpShape ) {
                  aRgn->Shapes = tmpShape;
               } else {
                  ffpmsg( "Failed to allocate memory for Region data");
                  *status = MEMORY_ALLOCATION;
                  goto error;
               }

            }
            newShape        = &aRgn->Shapes[aRgn->nShapes++];
            newShape->sign  = 1;
            newShape->shape = point_rgn;
	    for (i=0; i<8; i++) newShape->param.gen.p[i] = 0.0;
	    newShape->param.gen.a = 0.0;
	    newShape->param.gen.b = 0.0;
	    newShape->param.gen.sinT = 0.0;
	    newShape->param.gen.cosT = 0.0;

            while( isspace(*namePtr) ) namePtr++;
            
			/*  Check for the shape's sign  */

            if( *namePtr=='+' ) {
               namePtr++;
            } else if( *namePtr=='-' ) {
               namePtr++;
               newShape->sign = 0;
            }

            /* Skip white space in region name */

            while( isspace(*namePtr) ) namePtr++;
            if( *namePtr=='\0' ) {
               ffpmsg( "Error reading Region file" );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }
            lineLen = strlen( namePtr ) - 1;
            while( isspace(namePtr[lineLen]) ) namePtr[lineLen--] = '\0';

            /*  Now identify the region  */

            if(        !fits_strcasecmp( namePtr, "circle"  ) ) {
               newShape->shape = circle_rgn;
               if( nParams != 3 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "annulus" ) ) {
               newShape->shape = annulus_rgn;
               if( nParams != 4 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "ellipse" ) ) {
               if( nParams < 4 || nParams > 8 ) {
                  *status = PARSE_SYNTAX_ERR;
	       } else if ( nParams < 6 ) {
		 newShape->shape = ellipse_rgn;
		 newShape->param.gen.p[4] = 0.0;
	       } else {
		 newShape->shape = elliptannulus_rgn;
		 newShape->param.gen.p[6] = 0.0;
		 newShape->param.gen.p[7] = 0.0;
	       }
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "elliptannulus" ) ) {
               newShape->shape = elliptannulus_rgn;
               if( !( nParams==8 || nParams==6 ) )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[6] = 0.0;
               newShape->param.gen.p[7] = 0.0;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "box"    ) 
                    || !fits_strcasecmp( namePtr, "rotbox" ) ) {
	       if( nParams < 4 || nParams > 8 ) {
		 *status = PARSE_SYNTAX_ERR;
	       } else if ( nParams < 6 ) {
		 newShape->shape = box_rgn;
		 newShape->param.gen.p[4] = 0.0;
	       } else {
		  newShape->shape = boxannulus_rgn;
		  newShape->param.gen.p[6] = 0.0;
		  newShape->param.gen.p[7] = 0.0;
	       }
	       nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "rectangle"    )
                    || !fits_strcasecmp( namePtr, "rotrectangle" ) ) {
               newShape->shape = rectangle_rgn;
               if( nParams < 4 || nParams > 5 )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[4] = 0.0;
               nCoords = 4;
            } else if( !fits_strcasecmp( namePtr, "diamond"    )
                    || !fits_strcasecmp( namePtr, "rotdiamond" )
                    || !fits_strcasecmp( namePtr, "rhombus"    )
                    || !fits_strcasecmp( namePtr, "rotrhombus" ) ) {
               newShape->shape = diamond_rgn;
               if( nParams < 4 || nParams > 5 )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[4] = 0.0;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "sector"  )
                    || !fits_strcasecmp( namePtr, "pie"     ) ) {
               newShape->shape = sector_rgn;
               if( nParams != 4 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "point"   ) ) {
               newShape->shape = point_rgn;
               if( nParams != 2 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "line"    ) ) {
               newShape->shape = line_rgn;
               if( nParams != 4 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 4;
            } else if( !fits_strcasecmp( namePtr, "polygon" ) ) {
               newShape->shape = poly_rgn;
               if( nParams < 6 || (nParams&1) )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = nParams;
            } else if( !fits_strcasecmp( namePtr, "panda" ) ) {
               newShape->shape = panda_rgn;
               if( nParams != 8 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "epanda" ) ) {
               newShape->shape = epanda_rgn;
               if( nParams < 10 || nParams > 11 )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[10] = 0.0;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "bpanda" ) ) {
               newShape->shape = bpanda_rgn;
               if( nParams < 10 || nParams > 11 )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[10] = 0.0;
               nCoords = 2;
            } else {
               ffpmsg( "Unrecognized region found in region file:" );
               ffpmsg( namePtr );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }
            if( *status ) {
               ffpmsg( "Wrong number of parameters found for region" );
               ffpmsg( namePtr );
               goto error;
            }

            /*  Parse Parameter string... convert to pixels if necessary  */

            if( newShape->shape==poly_rgn ) {
               newShape->param.poly.Pts = (double *)malloc( nParams
                                                            * sizeof(double) );
               if( !newShape->param.poly.Pts ) {
                  ffpmsg(
                      "Could not allocate memory to hold polygon parameters" );
                  *status = MEMORY_ALLOCATION;
                  goto error;
               }
               newShape->param.poly.nPts = nParams;
               coords = newShape->param.poly.Pts;
            } else
               coords = newShape->param.gen.p;

            /*  Parse the initial "WCS?" coordinates  */
            for( i=0; i<nCoords; i+=2 ) {

               pX = paramPtr;
               while( *paramPtr!=',' ) paramPtr++;
               *(paramPtr++) = '\0';

               pY = paramPtr;
               while( *paramPtr!=',' && *paramPtr != '\0' ) paramPtr++;
               *(paramPtr++) = '\0';

               if( strchr(pX, ':' ) ) {
                  /*  Read in special format & convert to decimal degrees  */
                  cFmt = hhmmss_fmt;
                  mm = 0;
                  ss = 0.;
                  hh = strtol(pX, &endp, 10);
                  if (endp && *endp==':') {
                      pX = endp + 1;
                      mm = strtol(pX, &endp, 10);
                      if (endp && *endp==':') {
                          pX = endp + 1;
                          ss = atof( pX );
                      }
                  }
                  X = 15. * (hh + mm/60. + ss/3600.); /* convert to degrees */

                  mm = 0;
                  ss = 0.;
                  negdec = 0;

                  while( isspace(*pY) ) pY++;
                  if (*pY=='-') {
                      negdec = 1;
                      pY++;
                  }
                  dd = strtol(pY, &endp, 10);
                  if (endp && *endp==':') {
                      pY = endp + 1;
                      mm = strtol(pY, &endp, 10);
                      if (endp && *endp==':') {
                          pY = endp + 1;
                          ss = atof( pY );
                      }
                  }
                  if (negdec)
                     Y = -dd - mm/60. - ss/3600.; /* convert to degrees */
                  else
                     Y = dd + mm/60. + ss/3600.;

               } else {
                  X = atof( pX );
                  Y = atof( pY );
               }
               if (i==0) {   /* save 1st coord. in case needed later */
                   xsave = X;
                   ysave = Y;
               }

               if( cFmt!=pixel_fmt ) {
                  /*  Convert to pixels  */
                  if( wcs==NULL || ! wcs->exists ) {
                     ffpmsg("WCS information needed to convert region coordinates.");
                     *status = NO_WCS_KEY;
                     goto error;
                  }
                  
                  if( ffxypx(  X,  Y, wcs->xrefval, wcs->yrefval,
                                      wcs->xrefpix, wcs->yrefpix,
                                      wcs->xinc,    wcs->yinc,
                                      wcs->rot,     wcs->type,
                              &x, &y, status ) ) {
                     ffpmsg("Error converting region to pixel coordinates.");
                     goto error;
                  }
                  X = x; Y = y;
               }
               coords[i]   = X;
               coords[i+1] = Y;

            }

            /*  Read in remaining parameters...  */

            for( ; i<nParams; i++ ) {
               pX = paramPtr;
               while( *paramPtr!=',' && *paramPtr != '\0' ) paramPtr++;
               *(paramPtr++) = '\0';
               coords[i] = strtod( pX, &endp );

	       if (endp && (*endp=='"' || *endp=='\'' || *endp=='d') ) {
		  div = 1.0;
		  if ( *endp=='"' ) div = 3600.0;
		  if ( *endp=='\'' ) div = 60.0;
		  /* parameter given in arcsec so convert to pixels. */
		  /* Increment first Y coordinate by this amount then calc */
		  /* the distance in pixels from the original coordinate. */
		  /* NOTE: This assumes the pixels are square!! */
		  if (ysave < 0.)
		     Y = ysave + coords[i]/div;  /* don't exceed -90 */
		  else
		     Y = ysave - coords[i]/div;  /* don't exceed +90 */

		  X = xsave;
		  if( ffxypx(  X,  Y, wcs->xrefval, wcs->yrefval,
			       wcs->xrefpix, wcs->yrefpix,
			       wcs->xinc,    wcs->yinc,
			       wcs->rot,     wcs->type,
                               &x, &y, status ) ) {
		     ffpmsg("Error converting region to pixel coordinates.");
		     goto error;
		  }
		 
		  coords[i] = sqrt( pow(x-coords[0],2) + pow(y-coords[1],2) );

               }
            }

	    /* special case for elliptannulus and boxannulus if only one angle
	       was given */

	    if ( (newShape->shape == elliptannulus_rgn || 
		  newShape->shape == boxannulus_rgn ) && nParams == 7 ) {
	      coords[7] = coords[6];
	    }

            /* Also, correct the position angle for any WCS rotation:  */
            /*    If regions are specified in WCS coordintes, then the angles */
            /*    are relative to the WCS system, not the pixel X,Y system */

	    if( cFmt!=pixel_fmt ) {	    
	      switch( newShape->shape ) {
	      case sector_rgn:
	      case panda_rgn:
		coords[2] += (wcs->rot);
		coords[3] += (wcs->rot);
		break;
	      case box_rgn:
	      case rectangle_rgn:
	      case diamond_rgn:
	      case ellipse_rgn:
		coords[4] += (wcs->rot);
		break;
	      case boxannulus_rgn:
	      case elliptannulus_rgn:
		coords[6] += (wcs->rot);
		coords[7] += (wcs->rot);
		break;
	      case epanda_rgn:
	      case bpanda_rgn:
		coords[2] += (wcs->rot);
		coords[3] += (wcs->rot);
		coords[10] += (wcs->rot);
              default:
                break;
	      }
	    }

	    /* do some precalculations to speed up tests */

	    fits_setup_shape(newShape);

         }  /* End of while( *currLoc ) */
/*
  if (coords)printf("%.8f %.8f %.8f %.8f %.8f\n",
   coords[0],coords[1],coords[2],coords[3],coords[4]); 
*/
      }  /* End of if...else parse line */
   }   /* End of while( fgets(rgnFile) ) */

   /* set up component numbers */

   fits_set_region_components( aRgn );

error:

   if( *status ) {
      fits_free_region( aRgn );
   } else {
      *Rgn = aRgn;
   }

   fclose( rgnFile );
   free( currLine );

   return( *status );
}